

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mounts.cpp
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::Sys::Mounts::enable
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Mounts *this,SecretMount *path,Parameters *parameters,
          Parameters *options,Parameters *config)

{
  Client *client;
  string local_98;
  Parameters *local_78;
  Path local_70;
  Url local_50;
  
  client = *(Client **)this;
  local_78 = config;
  Vault::operator+(&local_98,"mounts/",path);
  local_70.value_._M_dataplus._M_p = (pointer)&local_70.value_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p == &local_98.field_2) {
    local_70.value_.field_2._8_8_ = local_98.field_2._8_8_;
  }
  else {
    local_70.value_._M_dataplus._M_p = local_98._M_dataplus._M_p;
  }
  local_70.value_._M_string_length = local_98._M_string_length;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  getUrl(&local_50,this,&local_70);
  HttpConsumer::post(__return_storage_ptr__,client,&local_50,parameters,options,local_78);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_98);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> Vault::Sys::Mounts::enable(
    const SecretMount &path, const Parameters &parameters,
    const Parameters &options, const Parameters &config) const {
  return HttpConsumer::post(client_, getUrl(Path{"mounts/" + path}), parameters,
                            options, config);
}